

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModelExtractor_impl.hpp
# Opt level: O1

void __thiscall
hiberlite::ModelExtractor::extractModel<X>(ModelExtractor *this,shared_connection *_con)

{
  _Rb_tree_header *p_Var1;
  int *piVar2;
  shared_cnt_obj_pair<hiberlite::autoclosed_con> *psVar3;
  X *obj;
  _Rb_tree_header *p_Var4;
  bean_key local_38;
  
  obj = (X *)operator_new(0x78);
  p_Var4 = &(obj->seti)._M_t._M_impl.super__Rb_tree_header;
  (obj->seti)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (obj->seti)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  (obj->seti)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  (obj->seti)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  *(undefined8 *)&(obj->mm)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  (obj->mm)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (obj->vvi).
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (obj->vvi).
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (obj->vvi).
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined8 *)&(obj->mm)._M_t._M_impl = 0;
  (obj->mm)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  (obj->mm)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  *(undefined8 *)&(obj->seti)._M_t._M_impl = 0;
  *(undefined8 *)&(obj->seti)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  (obj->mm)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(obj->mm)._M_t._M_impl.super__Rb_tree_header;
  (obj->seti)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var4->_M_header;
  (obj->seti)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var4->_M_header;
  (obj->mm)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (obj->mm)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (obj->seti)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (obj->vvi).
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (obj->vvi).
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (obj->vvi).
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (obj->mm)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (obj->mm)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  psVar3 = _con->res;
  if (psVar3 != (shared_cnt_obj_pair<hiberlite::autoclosed_con> *)0x0) {
    piVar2 = &psVar3->refCount;
    *piVar2 = *piVar2 + 1;
    if (*piVar2 == 0) {
      (*psVar3->_vptr_shared_cnt_obj_pair[1])(psVar3);
    }
  }
  local_38.id = -1;
  local_38.con._vptr_shared_res = (_func_int **)&PTR__shared_res_001d4578;
  if (psVar3 != (shared_cnt_obj_pair<hiberlite::autoclosed_con> *)0x0) {
    psVar3->refCount = psVar3->refCount + 1;
  }
  local_38.con.res = psVar3;
  AVisitor<hiberlite::ExtractModel>::startWalk<X>
            (&this->super_AVisitor<hiberlite::ExtractModel>,obj,&local_38);
  local_38.con._vptr_shared_res = (_func_int **)&PTR__shared_res_001d4578;
  if (local_38.con.res != (shared_cnt_obj_pair<hiberlite::autoclosed_con> *)0x0) {
    piVar2 = &(local_38.con.res)->refCount;
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      (*(local_38.con.res)->_vptr_shared_cnt_obj_pair[1])();
    }
  }
  access::destroy<hiberlite::ModelExtractor,X>(this,obj);
  if (psVar3 != (shared_cnt_obj_pair<hiberlite::autoclosed_con> *)0x0) {
    piVar2 = &psVar3->refCount;
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      (*psVar3->_vptr_shared_cnt_obj_pair[1])(psVar3);
    }
  }
  return;
}

Assistant:

void ModelExtractor::extractModel(shared_connection _con)
{
	C* bean;
	construct(*this, &bean, static_cast<unsigned int>(0));
	bean_key key(_con, Database::NULL_ID);
	startWalk(*bean, key);
	destroy(*this, bean, static_cast<unsigned int>(0));
}